

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void FBehavior::StaticLoadDefaultModules(void)

{
  bool bVar1;
  int lumpnum;
  int acslump;
  undefined1 local_110 [8];
  FScanner sc;
  int lastlump;
  int lump;
  
  sc.LastGotLine = 0;
  while (sc._252_4_ = FWadCollection::FindLump(&Wads,"LOADACS",&sc.LastGotLine,false),
        sc._252_4_ != -1) {
    FScanner::FScanner((FScanner *)local_110,sc._252_4_);
    while (bVar1 = FScanner::GetString((FScanner *)local_110), bVar1) {
      lumpnum = FWadCollection::CheckNumForName(&Wads,(char *)local_110,4);
      if (lumpnum < 0) {
        Printf("\x1cGCould not find autoloaded ACS library %s\n",local_110);
      }
      else {
        StaticLoadModule(lumpnum,(FileReader *)0x0,0);
      }
    }
    FScanner::~FScanner((FScanner *)local_110);
  }
  return;
}

Assistant:

void FBehavior::StaticLoadDefaultModules ()
{
	// Scan each LOADACS lump and load the specified modules in order
	int lump, lastlump = 0;

	while ((lump = Wads.FindLump ("LOADACS", &lastlump)) != -1)
	{
		FScanner sc(lump);
		while (sc.GetString())
		{
			int acslump = Wads.CheckNumForName (sc.String, ns_acslibrary);
			if (acslump >= 0)
			{
				StaticLoadModule (acslump);
			}
			else
			{
				Printf (TEXTCOLOR_RED "Could not find autoloaded ACS library %s\n", sc.String);
			}
		}
	}
}